

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O0

int mtar_write_file_header(mtar_t *tar,char *name,size_t size)

{
  size_t sVar1;
  time_t tVar2;
  undefined1 local_108 [8];
  mtar_header_t h;
  size_t size_local;
  char *name_local;
  mtar_t *tar_local;
  
  h.linkname._92_8_ = size;
  sVar1 = strlen(name);
  if (sVar1 < 100) {
    memset(local_108,0,0xe0);
    strcpy((char *)&h.mtime,name);
    h._0_8_ = h.linkname._92_8_;
    h.size._4_4_ = 0x30;
    local_108._0_4_ = 0x1b4;
    tVar2 = time((time_t *)0x0);
    h.size._0_4_ = (undefined4)tVar2;
    tar_local._4_4_ = mtar_write_header(tar,(mtar_header_t *)local_108);
  }
  else {
    tar_local._4_4_ = -9;
  }
  return tar_local._4_4_;
}

Assistant:

int mtar_write_file_header(mtar_t *tar, const char *name, size_t size) {
  mtar_header_t h;
  if (strlen(name) > MTAR_NAMEMAX)
    return MTAR_ENAMELONG;
  /* Build header */
  memset(&h, 0, sizeof(h));
  strcpy(h.name, name);
  h.size = size;
  h.type = MTAR_TREG;
  h.mode = 0664;
  h.mtime = time(NULL);
  /* Write header */
  return mtar_write_header(tar, &h);
}